

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O2

string * __thiscall
flatbuffers::cpp::CppGenerator::GetNestedFlatBufferName_abi_cxx11_
          (string *__return_storage_ptr__,CppGenerator *this,FieldDef *field)

{
  Value *pVVar1;
  StructDef *pSVar2;
  string *id;
  string qualified_name;
  string local_60;
  string local_40;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"nested_flatbuffer",(allocator<char> *)&local_40);
  pVVar1 = SymbolTable<flatbuffers::Value>::Lookup(&(field->super_Definition).attributes,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  if (pVVar1 == (Value *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",(allocator<char> *)&local_60);
  }
  else {
    id = &pVVar1->constant;
    std::__cxx11::string::string((string *)&local_60,(string *)id);
    pSVar2 = Parser::LookupStruct((this->super_BaseGenerator).parser_,id);
    if (pSVar2 == (StructDef *)0x0) {
      Namespace::GetFullyQualifiedName
                (&local_40,((this->super_BaseGenerator).parser_)->current_namespace_,id,1000);
      std::__cxx11::string::operator=((string *)&local_60,(string *)&local_40);
      std::__cxx11::string::~string((string *)&local_40);
      pSVar2 = Parser::LookupStruct((this->super_BaseGenerator).parser_,&local_60);
      if (pSVar2 == (StructDef *)0x0) {
        __assert_fail("nested_root",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_cpp.cpp"
                      ,0xae5,
                      "std::string flatbuffers::cpp::CppGenerator::GetNestedFlatBufferName(const FieldDef &)"
                     );
      }
    }
    TranslateNameSpace(__return_storage_ptr__,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GetNestedFlatBufferName(const FieldDef &field) {
    auto nested = field.attributes.Lookup("nested_flatbuffer");
    if (!nested) return "";
    std::string qualified_name = nested->constant;
    auto nested_root = parser_.LookupStruct(nested->constant);
    if (nested_root == nullptr) {
      qualified_name =
          parser_.current_namespace_->GetFullyQualifiedName(nested->constant);
      nested_root = parser_.LookupStruct(qualified_name);
    }
    FLATBUFFERS_ASSERT(nested_root);  // Guaranteed to exist by parser.
    (void)nested_root;
    return TranslateNameSpace(qualified_name);
  }